

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

Var __thiscall
Js::SourceTextModuleRecord::PostProcessDynamicModuleImport(SourceTextModuleRecord *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  JavascriptPromise *pJVar4;
  ScriptContext *scriptContext_00;
  undefined4 *puVar5;
  void **ppvVar6;
  char16 *pcVar7;
  ThreadContext *pTVar8;
  HostScriptContext *pHVar9;
  Recycler *pRVar10;
  JavascriptLibrary *this_00;
  JavascriptError *pError;
  JavascriptPromise **ppJVar11;
  Var pvVar12;
  JavascriptError *error;
  TrackAllocData local_c8;
  char16_t *local_a0;
  char16 *allocatedString;
  size_t length;
  char16 *moduleName;
  Data local_80 [2];
  Data __exceptionCheck;
  undefined1 local_70 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  HRESULT hr;
  ScriptContext *scriptContext;
  JavascriptPromise *promise;
  SourceTextModuleRecord *this_local;
  
  pJVar4 = GetPromise(this);
  scriptContext_00 = GetScriptContext(this);
  if (scriptContext_00 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x12f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pJVar4 == (JavascriptPromise *)0x0) {
    pJVar4 = JavascriptPromise::CreateEnginePromise(scriptContext_00);
    SetPromise(this,pJVar4);
  }
  bVar2 = ParentsNotified(this);
  if (bVar2) {
    __frameAddr._4_4_ = 0;
    bVar2 = WasDeclarationInitialized(this);
    if (!bVar2) {
      uVar3 = (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])();
      if ((uVar3 & 1) != 0) {
        (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0xb])();
      }
      ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&this->errorObject);
      if (*ppvVar6 == (void *)0x0) {
        if (((this->hadNotifyHostReady & 1U) == 0) &&
           (bVar2 = ModuleRecordBase::WasEvaluated(&this->super_ModuleRecordBase), !bVar2)) {
          pcVar7 = GetSpecifierSz(this);
          Output::TraceWithFlush
                    (ModulePhase,
                     L"\t>NotifyHostAboutModuleReady %s (PostProcessDynamicModuleImport)\n",pcVar7);
          pTVar8 = ScriptContext::GetThreadContext(scriptContext_00);
          bVar2 = ThreadContext::IsScriptActive(pTVar8);
          if (bVar2) {
            LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                      ((LeaveScriptObject<true,_true,_false> *)
                       &autoReentrancyHandler.m_savedReentrancySafeOrHandled,scriptContext_00,
                       &stack0xfffffffffffffff8);
            pTVar8 = ScriptContext::GetThreadContext(scriptContext_00);
            AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_70,pTVar8);
            pHVar9 = ScriptContext::GetHostScriptContext(scriptContext_00);
            ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                ((WriteBarrierPtr *)&this->errorObject);
            __frameAddr._4_4_ = (*pHVar9->_vptr_HostScriptContext[0x14])(pHVar9,this,*ppvVar6);
            if (scriptContext_00 != (ScriptContext *)0x0) {
              pTVar8 = ScriptContext::GetThreadContext(scriptContext_00);
              ThreadContext::DisposeOnLeaveScript(pTVar8);
            }
            AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_70);
            LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                      ((LeaveScriptObject<true,_true,_false> *)
                       &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
          }
          else {
            moduleName._4_4_ = ExceptionCheck::Save();
            local_80[0] = moduleName._4_4_;
            pHVar9 = ScriptContext::GetHostScriptContext(scriptContext_00);
            ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                ((WriteBarrierPtr *)&this->errorObject);
            __frameAddr._4_4_ = (*pHVar9->_vptr_HostScriptContext[0x14])(pHVar9,this,*ppvVar6);
            ExceptionCheck::Restore(local_80);
          }
          this->hadNotifyHostReady = true;
        }
      }
      else {
        ReleaseParserResourcesForHierarchy(this);
        ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&this->errorObject);
        ResolveOrRejectDynamicImportPromise(false,*ppvVar6,scriptContext_00,this,false);
      }
    }
    if (__frameAddr._4_4_ < 0) {
      ReleaseParserResourcesForHierarchy(this);
      length = (size_t)GetSpecifierSz(this);
      allocatedString = (char16 *)PAL_wcslen((char16_t *)length);
      pRVar10 = ScriptContext::GetRecycler(scriptContext_00);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_c8,(type_info *)&char16_t::typeinfo,0,(long)allocatedString + 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                 ,0x15d);
      pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_c8);
      local_a0 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeaf,0,
                            (long)allocatedString + 1);
      wmemcpy_s(local_a0,(long)allocatedString + 1,(char16 *)length,(size_t)allocatedString);
      local_a0[(long)allocatedString] = L'\0';
      this_00 = ScriptContext::GetLibrary(scriptContext_00);
      pError = JavascriptLibrary::CreateURIError(this_00);
      JavascriptError::SetErrorMessageProperties(pError,__frameAddr._4_4_,local_a0,scriptContext_00)
      ;
      pvVar12 = ResolveOrRejectDynamicImportPromise(false,pError,scriptContext_00,this,true);
      return pvVar12;
    }
  }
  ppJVar11 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromise__
                       ((WriteBarrierPtr *)&this->promise);
  pvVar12 = JavascriptPromise::CreatePassThroughPromise(*ppJVar11,scriptContext_00);
  return pvVar12;
}

Assistant:

Var SourceTextModuleRecord::PostProcessDynamicModuleImport()
    {
        JavascriptPromise *promise = this->GetPromise();
        ScriptContext* scriptContext = GetScriptContext();
        AnalysisAssert(scriptContext != nullptr);
        if (promise == nullptr)
        {
            promise = JavascriptPromise::CreateEnginePromise(scriptContext);
            this->SetPromise(promise);
        }

        if (this->ParentsNotified())
        {
            HRESULT hr = NOERROR;
            if (!WasDeclarationInitialized())
            {
                if (ModuleDeclarationInstantiation())
                {
                    GenerateRootFunction();
                }

                if (this->errorObject != nullptr)
                {
                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                    SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, this->errorObject, scriptContext, this, false);
                }
                else
                {
                    if (!hadNotifyHostReady && !WasEvaluated())
                    {
                        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (PostProcessDynamicModuleImport)\n"), this->GetSpecifierSz());
                        LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                        {
                            hr = scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                        });

                        hadNotifyHostReady = true;
                    }
                }
            }

            if (FAILED(hr))
            {
                // Cleanup in case of error.
                this->ReleaseParserResourcesForHierarchy();

                // We cannot just use the buffer in the specifier string - need to make a copy here.
                const char16* moduleName = this->GetSpecifierSz();
                size_t length = wcslen(moduleName);
                char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
                wmemcpy_s(allocatedString, length + 1, moduleName, length);
                allocatedString[length] = _u('\0');

                Js::JavascriptError * error = scriptContext->GetLibrary()->CreateURIError();
                JavascriptError::SetErrorMessageProperties(error, hr, allocatedString, scriptContext);
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext, this);
            }
        }

        return JavascriptPromise::CreatePassThroughPromise(this->promise, scriptContext);
    }